

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O1

void draw_filesave(Fl_Color c)

{
  Fl_Color FVar1;
  
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,c);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfeccccccccccccd,0xbff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3feccccccccccccd,0xbff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3ff0000000000000,0xbfeccccccccccccd);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3ff0000000000000,0x3feccccccccccccd);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3feccccccccccccd,0x3ff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfeccccccccccccd,0x3ff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbff0000000000000,0x3feccccccccccccd);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbff0000000000000,0xbfeccccccccccccd);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  FVar1 = fl_color_average(c,0xff,0.67);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfe6666666666666,0xbff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fe6666666666666,0xbff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fe6666666666666,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfe6666666666666,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0xbfe6666666666666,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0x3fe6666666666666,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fe6666666666666,0x3ff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfe6666666666666,0x3ff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,c);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfe0000000000000,0xbfeccccccccccccd);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfd3333333333333,0xbfeccccccccccccd);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfd3333333333333,0xbfe0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfe0000000000000,0xbfe0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  FVar1 = fl_color_average(c,0x38,0.67);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfeccccccccccccd,0xbff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3feccccccccccccd,0xbff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3ff0000000000000,0xbfeccccccccccccd);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3ff0000000000000,0x3feccccccccccccd);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3feccccccccccccd,0x3ff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfeccccccccccccd,0x3ff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbff0000000000000,0x3feccccccccccccd);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbff0000000000000,0xbfeccccccccccccd);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
  return;
}

Assistant:

static void draw_filesave(Fl_Color c) {
  fl_color(c);
  BP;
    vv(-0.9, -1.0);
    vv(0.9, -1.0);
    vv(1.0, -0.9);
    vv(1.0, 0.9);
    vv(0.9, 1.0);
    vv(-0.9, 1.0);
    vv(-1.0, 0.9);
    vv(-1.0, -0.9);
  EP;

  fl_color(fl_lighter(c));
  BP;
    vv(-0.7, -1.0);
    vv(0.7, -1.0);
    vv(0.7, -0.4);
    vv(-0.7, -0.4);
  EP;

  BP;
    vv(-0.7, 0.0);
    vv(0.7, 0.0);
    vv(0.7, 1.0);
    vv(-0.7, 1.0);
  EP;

  fl_color(c);
  BP;
    vv(-0.5, -0.9);
    vv(-0.3, -0.9);
    vv(-0.3, -0.5);
    vv(-0.5, -0.5);
  EP;

  fl_color(fl_darker(c));
  BC;
    vv(-0.9, -1.0);
    vv(0.9, -1.0);
    vv(1.0, -0.9);
    vv(1.0, 0.9);
    vv(0.9, 1.0);
    vv(-0.9, 1.0);
    vv(-1.0, 0.9);
    vv(-1.0, -0.9);
  EC;
}